

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRReader.cpp
# Opt level: O2

Barcode * __thiscall
ZXing::QRCode::Reader::decode(Barcode *__return_storage_ptr__,Reader *this,BinaryBitmap *image)

{
  uint uVar1;
  BitMatrix *image_00;
  BarcodeFormat format;
  BarcodeFormat BVar2;
  DetectorResult detectorResult;
  DecoderResult decoderResult;
  
  if ((undefined1  [12])((undefined1  [12])*(this->super_Reader)._opts & (undefined1  [12])0x10) ==
      (undefined1  [12])0x0) {
    (*(this->super_Reader)._vptr_Reader[3])(&decoderResult,this,image,1);
    FirstOrDefault<std::vector,_ZXing::Result,_std::allocator<ZXing::Result>_>
              (__return_storage_ptr__,
               (vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)&decoderResult);
    std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::~vector
              ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)&decoderResult);
  }
  else {
    image_00 = BinaryBitmap::getBitMatrix(image);
    if (image_00 == (BitMatrix *)0x0) {
      memset(__return_storage_ptr__,0,0xd8);
      Result::Result(__return_storage_ptr__);
    }
    else {
      detectorResult._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
      detectorResult._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
      detectorResult._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
      detectorResult._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
      detectorResult._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
      detectorResult._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
      detectorResult._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
      detectorResult._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
      detectorResult._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      detectorResult._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      detectorResult._bits._width = 0;
      detectorResult._bits._height = 0;
      detectorResult._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      uVar1 = (((this->super_Reader)._opts)->_formats).i;
      if (uVar1 == 0 || (uVar1 >> 0xd & 1) != 0) {
        DetectPureQR((DetectorResult *)&decoderResult,image_00);
        DetectorResult::operator=(&detectorResult,(DetectorResult *)&decoderResult);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &decoderResult._content.bytes.
                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish);
        uVar1 = (((this->super_Reader)._opts)->_formats).i;
      }
      if ((uVar1 == 0 || (uVar1 >> 0x10 & 1) != 0) &&
         (detectorResult._bits._bits.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start ==
          detectorResult._bits._bits.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish)) {
        DetectPureMQR((DetectorResult *)&decoderResult,image_00);
        DetectorResult::operator=(&detectorResult,(DetectorResult *)&decoderResult);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &decoderResult._content.bytes.
                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish);
        uVar1 = (((this->super_Reader)._opts)->_formats).i;
      }
      if ((uVar1 == 0 || (uVar1 >> 0x11 & 1) != 0) &&
         (detectorResult._bits._bits.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start ==
          detectorResult._bits._bits.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish)) {
        DetectPureRMQR((DetectorResult *)&decoderResult,image_00);
        DetectorResult::operator=(&detectorResult,(DetectorResult *)&decoderResult);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &decoderResult._content.bytes.
                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish);
      }
      if (detectorResult._bits._bits.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start ==
          detectorResult._bits._bits.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        memset(__return_storage_ptr__,0,0xd8);
        Result::Result(__return_storage_ptr__);
      }
      else {
        Decode(&decoderResult,&detectorResult._bits);
        BVar2 = QRCode;
        if (detectorResult._bits._width < 0x15) {
          BVar2 = MicroQRCode;
        }
        format = RMQRCode;
        if (detectorResult._bits._width == detectorResult._bits._height) {
          format = BVar2;
        }
        Result::Result(__return_storage_ptr__,&decoderResult,&detectorResult,format);
        DecoderResult::~DecoderResult(&decoderResult);
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&detectorResult._bits._bits.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Barcode Reader::decode(const BinaryBitmap& image) const
{
#if 1
	if (!_opts.isPure())
		return FirstOrDefault(decode(image, 1));
#endif

	auto binImg = image.getBitMatrix();
	if (binImg == nullptr)
		return {};

	DetectorResult detectorResult;
	if (_opts.hasFormat(BarcodeFormat::QRCode))
		detectorResult = DetectPureQR(*binImg);
	if (_opts.hasFormat(BarcodeFormat::MicroQRCode) && !detectorResult.isValid())
		detectorResult = DetectPureMQR(*binImg);
	if (_opts.hasFormat(BarcodeFormat::RMQRCode) && !detectorResult.isValid())
		detectorResult = DetectPureRMQR(*binImg);

	if (!detectorResult.isValid())
		return {};

	auto decoderResult = Decode(detectorResult.bits());
	auto format = detectorResult.bits().width() != detectorResult.bits().height() ? BarcodeFormat::RMQRCode
				  : detectorResult.bits().width() < 21                            ? BarcodeFormat::MicroQRCode
																				  : BarcodeFormat::QRCode;

	return Barcode(std::move(decoderResult), std::move(detectorResult), format);
}